

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O2

ON_wString __thiscall ON_RenderContent::XML(ON_RenderContent *this,bool recursive)

{
  uint uVar1;
  ON_XMLNode *pOVar2;
  wchar_t *s;
  int in_EDX;
  undefined7 in_register_00000031;
  
  if (in_EDX == 0) {
    pOVar2 = &((ON_RenderContent *)CONCAT71(in_register_00000031,recursive))->_private->m_node;
  }
  else {
    pOVar2 = ON_RenderContentPrivate::NewXMLNodeRecursive
                       ((ON_RenderContent *)CONCAT71(in_register_00000031,recursive));
  }
  uVar1 = (*pOVar2->_vptr_ON_XMLNode[0x1b])(pOVar2,0,0,1,0,0);
  s = (wchar_t *)operator_new__((ulong)uVar1 * 4 + 4);
  (*pOVar2->_vptr_ON_XMLNode[0x1b])(pOVar2,s,(ulong)uVar1,1,0,0);
  s[uVar1] = L'\0';
  ON_wString::ON_wString((ON_wString *)this,s);
  operator_delete__(s);
  if ((char)in_EDX != '\0') {
    (*pOVar2->_vptr_ON_XMLNode[1])(pOVar2);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

ON_wString ON_RenderContent::XML(bool recursive) const
{
  ON_XMLNode* node = &_private->m_node;

  if (recursive)
  {
    node = ON_RenderContentPrivate::NewXMLNodeRecursive(*this);
  }

  const ON__UINT32 logical_count = node->WriteToStream(nullptr, 0);
  auto* stream = new wchar_t[size_t(logical_count) + 1];
  node->WriteToStream(stream, logical_count);
  stream[logical_count] = 0;
  const ON_wString xml = stream;
  delete[] stream;

  if (recursive)
    delete node;

  return xml;
}